

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidBatchnorm(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar4;
  NeuralNetworkLayer *this_00;
  BatchnormLayerParams *this_01;
  WeightParams *pWVar5;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pNVar4 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar4->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(this_00);
  this_01->channels_ = 5;
  iVar7 = 5;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    pWVar5 = CoreML::Specification::BatchnormLayerParams::mutable_beta(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
    pWVar5 = CoreML::Specification::BatchnormLayerParams::mutable_gamma(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
  }
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar8 = CoreML::Result::good(&res);
  if (bVar8) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xb28);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar8;
}

Assistant:

int testInvalidBatchnorm() {

    Specification::Model m1;

    int num_inputs = 5;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *batchnormLayer = nn->add_layers();
    batchnormLayer->add_input("input");
    batchnormLayer->add_output("probs");
    auto *params = batchnormLayer->mutable_batchnorm();
    params->set_channels(num_inputs);

    for (int i = 0; i < num_inputs; i++) {
        params->mutable_beta()->add_floatvalue(1.0);
        params->mutable_gamma()->add_floatvalue(1.0);
    }
    // Invalid because the mean and variance should be provided

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}